

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5ParseNearsetFree(Fts5ExprNearset *pNear)

{
  int local_14;
  int i;
  Fts5ExprNearset *pNear_local;
  
  if (pNear != (Fts5ExprNearset *)0x0) {
    for (local_14 = 0; local_14 < pNear->nPhrase; local_14 = local_14 + 1) {
      fts5ExprPhraseFree(pNear->apPhrase[local_14]);
    }
    sqlite3_free(pNear->pColset);
    sqlite3_free(pNear);
  }
  return;
}

Assistant:

static void sqlite3Fts5ParseNearsetFree(Fts5ExprNearset *pNear){
  if( pNear ){
    int i;
    for(i=0; i<pNear->nPhrase; i++){
      fts5ExprPhraseFree(pNear->apPhrase[i]);
    }
    sqlite3_free(pNear->pColset);
    sqlite3_free(pNear);
  }
}